

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void * __thiscall
pbrt::TrackedMemoryResource::do_allocate(TrackedMemoryResource *this,size_t size,size_t alignment)

{
  ulong uVar1;
  ulong *puVar2;
  ulong uVar3;
  long in_RSI;
  long in_RDI;
  uint64_t prevMax;
  uint64_t currentBytes;
  void *ptr;
  memory_order __b;
  size_t in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  memory_order in_stack_fffffffffffffde4;
  byte local_ed;
  ulong local_c0;
  ulong local_b8;
  void *local_b0;
  long local_a0;
  long local_90;
  long local_88;
  undefined4 local_7c;
  long local_78;
  long *local_70;
  ulong local_68;
  memory_order local_60;
  int local_5c;
  ulong *local_58;
  undefined4 local_4c;
  ulong local_48;
  ulong *local_40;
  ulong *local_38;
  bool local_29;
  ulong local_28;
  memory_order local_20;
  undefined4 local_1c;
  ulong local_18;
  ulong *local_10;
  ulong *local_8;
  
  local_a0 = in_RSI;
  local_b0 = pstd::pmr::memory_resource::allocate
                       ((memory_resource *)
                        CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                        in_stack_fffffffffffffdd8,0x76c0e8);
  local_70 = (long *)(in_RDI + 0x10);
  local_78 = local_a0;
  local_7c = 5;
  local_88 = local_a0;
  LOCK();
  local_90 = *local_70;
  *local_70 = *local_70 + local_a0;
  UNLOCK();
  local_b8 = local_90 + local_a0;
  puVar2 = (ulong *)(in_RDI + 0x18);
  local_5c = 0;
  local_58 = puVar2;
  local_60 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_5c - 1U < 2) {
    local_68 = *puVar2;
  }
  else if (local_5c == 5) {
    local_68 = *puVar2;
  }
  else {
    local_68 = *puVar2;
  }
  local_c0 = local_68;
  do {
    uVar1 = local_b8;
    local_ed = 0;
    if (local_c0 < local_b8) {
      puVar2 = (ulong *)(in_RDI + 0x18);
      local_48 = local_b8;
      local_4c = 5;
      local_40 = &local_c0;
      local_38 = puVar2;
      local_20 = std::__cmpexch_failure_order(in_stack_fffffffffffffde4);
      local_18 = uVar1;
      local_1c = 5;
      local_28 = uVar1;
      switch(0x76c4ee) {
      default:
        if (local_20 - memory_order_consume < 2) {
          LOCK();
          uVar3 = *puVar2;
          local_29 = local_c0 == uVar3;
          if (local_29) {
            *puVar2 = uVar1;
            uVar3 = local_c0;
          }
          UNLOCK();
          if (!local_29) {
            local_c0 = uVar3;
          }
        }
        else if (local_20 == memory_order_seq_cst) {
          LOCK();
          uVar3 = *puVar2;
          local_29 = local_c0 == uVar3;
          if (local_29) {
            *puVar2 = uVar1;
            uVar3 = local_c0;
          }
          UNLOCK();
          if (!local_29) {
            local_c0 = uVar3;
          }
        }
        else {
          LOCK();
          uVar3 = *puVar2;
          local_29 = local_c0 == uVar3;
          if (local_29) {
            *puVar2 = uVar1;
            uVar3 = local_c0;
          }
          UNLOCK();
          if (!local_29) {
            local_c0 = uVar3;
          }
        }
        break;
      case 2:
        if (local_20 - memory_order_consume < 2) {
          LOCK();
          uVar3 = *puVar2;
          local_29 = local_c0 == uVar3;
          if (local_29) {
            *puVar2 = uVar1;
            uVar3 = local_c0;
          }
          UNLOCK();
          if (!local_29) {
            local_c0 = uVar3;
          }
        }
        else if (local_20 == memory_order_seq_cst) {
          LOCK();
          uVar3 = *puVar2;
          local_29 = local_c0 == uVar3;
          if (local_29) {
            *puVar2 = uVar1;
            uVar3 = local_c0;
          }
          UNLOCK();
          if (!local_29) {
            local_c0 = uVar3;
          }
        }
        else {
          LOCK();
          uVar3 = *puVar2;
          local_29 = local_c0 == uVar3;
          if (local_29) {
            *puVar2 = uVar1;
            uVar3 = local_c0;
          }
          UNLOCK();
          if (!local_29) {
            local_c0 = uVar3;
          }
        }
        break;
      case 3:
        if (local_20 - memory_order_consume < 2) {
          LOCK();
          uVar3 = *puVar2;
          local_29 = local_c0 == uVar3;
          if (local_29) {
            *puVar2 = uVar1;
            uVar3 = local_c0;
          }
          UNLOCK();
          if (!local_29) {
            local_c0 = uVar3;
          }
        }
        else if (local_20 == memory_order_seq_cst) {
          LOCK();
          uVar3 = *puVar2;
          local_29 = local_c0 == uVar3;
          if (local_29) {
            *puVar2 = uVar1;
            uVar3 = local_c0;
          }
          UNLOCK();
          if (!local_29) {
            local_c0 = uVar3;
          }
        }
        else {
          LOCK();
          uVar3 = *puVar2;
          local_29 = local_c0 == uVar3;
          if (local_29) {
            *puVar2 = uVar1;
            uVar3 = local_c0;
          }
          UNLOCK();
          if (!local_29) {
            local_c0 = uVar3;
          }
        }
        break;
      case 4:
        if (local_20 - memory_order_consume < 2) {
          LOCK();
          uVar3 = *puVar2;
          local_29 = local_c0 == uVar3;
          if (local_29) {
            *puVar2 = uVar1;
            uVar3 = local_c0;
          }
          UNLOCK();
          if (!local_29) {
            local_c0 = uVar3;
          }
        }
        else if (local_20 == memory_order_seq_cst) {
          LOCK();
          uVar3 = *puVar2;
          local_29 = local_c0 == uVar3;
          if (local_29) {
            *puVar2 = uVar1;
            uVar3 = local_c0;
          }
          UNLOCK();
          in_stack_fffffffffffffde4 = CONCAT13(local_29,(int3)in_stack_fffffffffffffde4);
          if (!local_29) {
            local_c0 = uVar3;
          }
        }
        else {
          LOCK();
          uVar3 = *puVar2;
          local_29 = local_c0 == uVar3;
          if (local_29) {
            *puVar2 = uVar1;
            uVar3 = local_c0;
          }
          UNLOCK();
          if (!local_29) {
            local_c0 = uVar3;
          }
        }
      }
      local_ed = local_29 ^ 0xff;
      local_10 = &local_c0;
      local_8 = puVar2;
    }
  } while ((local_ed & 1) != 0);
  return local_b0;
}

Assistant:

void *do_allocate(size_t size, size_t alignment) {
        void *ptr = source->allocate(size, alignment);
        uint64_t currentBytes = allocatedBytes.fetch_add(size) + size;
        uint64_t prevMax = maxAllocatedBytes.load(std::memory_order_relaxed);
        while (prevMax < currentBytes &&
               !maxAllocatedBytes.compare_exchange_weak(prevMax, currentBytes))
            ;
        return ptr;
    }